

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_recv(int s,void *buf,size_t len,int flags)

{
  int iVar1;
  undefined1 local_58 [8];
  nn_msghdr hdr;
  nn_iovec iov;
  int flags_local;
  size_t len_local;
  void *buf_local;
  int s_local;
  
  local_58 = (undefined1  [8])&hdr.msg_controllen;
  hdr.msg_iov._0_4_ = 1;
  hdr.msg_iovlen = 0;
  hdr._12_4_ = 0;
  hdr.msg_control = (void *)0x0;
  hdr.msg_controllen = (size_t)buf;
  iVar1 = nn_recvmsg(s,(nn_msghdr *)local_58,flags);
  return iVar1;
}

Assistant:

int nn_recv (int s, void *buf, size_t len, int flags)
{
    struct nn_iovec iov;
    struct nn_msghdr hdr;

    iov.iov_base = buf;
    iov.iov_len = len;

    hdr.msg_iov = &iov;
    hdr.msg_iovlen = 1;
    hdr.msg_control = NULL;
    hdr.msg_controllen = 0;

    return nn_recvmsg (s, &hdr, flags);
}